

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O2

wstring * cfgfile::
          format_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_cfgfile::string_trait_t>
          ::from_string(wstring *__return_storage_ptr__,
                       parser_info_t<cfgfile::string_trait_t> *param_1,string_t *value)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  __first._M_current = (value->_M_dataplus)._M_p;
  std::__cxx11::wstring::assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((wstring *)__return_storage_ptr__,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + value->_M_string_length));
  return __return_storage_ptr__;
}

Assistant:

static std::wstring from_string( const parser_info_t< string_trait_t > &,
		const string_trait_t::string_t & value )
	{
		std::wstring res;
		res.assign( value.cbegin(), value.cend() );

		return res;
	}